

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.cpp
# Opt level: O0

bool __thiscall jbcoin::STBlob::isEquivalent(STBlob *this,STBase *t)

{
  bool local_39;
  long local_38;
  STBlob *v;
  STBase *t_local;
  STBlob *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if (local_38 != 0) {
    local_39 = jbcoin::operator==(&this->value_,(Buffer *)(local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool
STBlob::isEquivalent (const STBase& t) const
{
    const STBlob* v = dynamic_cast<const STBlob*> (&t);
    return v && (value_ == v->value_);
}